

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O2

int __thiscall cppcms::json::anon_unknown_9::tockenizer::next(tockenizer *this)

{
  pointer pcVar1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  p;
  bool bVar2;
  uint i;
  int iVar3;
  uint uVar4;
  uint uVar5;
  long *plVar6;
  long lVar7;
  ushort uVar8;
  uint uVar9;
  uint32_t x;
  char buf [5];
  uint local_34;
  
  uVar9 = 0x100;
switchD_0021e7a6_caseD_20:
  iVar3 = std::streambuf::sbumpc();
  switch(iVar3) {
  case 0x20:
    goto switchD_0021e7a6_caseD_20;
  case 0x21:
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2e:
    goto switchD_0021e7a6_caseD_21;
  case 0x22:
    std::streambuf::sungetc();
    pcVar1 = (this->str)._M_dataplus._M_p;
    (this->str)._M_string_length = 0;
    *pcVar1 = '\0';
    iVar3 = std::streambuf::sbumpc();
    if (iVar3 != 0x22) {
      return 0x100;
    }
    bVar2 = false;
    uVar5 = 0;
    break;
  case 0x2c:
  case 0x3a:
    goto switchD_0021e7a6_caseD_21;
  case 0x2d:
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
    std::streambuf::sungetc();
    std::istream::_M_extract<double>((double *)this->is_);
    return (uint)(((byte)this->is_[*(long *)(*(long *)this->is_ + -0x18) + 0x20] & 5) == 0) * 2 +
           0x100;
  case 0x2f:
    bVar2 = check(this,"/");
    if (!bVar2) {
      return 0x100;
    }
    do {
      iVar3 = std::streambuf::sbumpc();
      if (iVar3 == -1) {
        return 0xff;
      }
    } while (iVar3 != 10);
    goto switchD_0021e7a6_caseD_20;
  default:
    if (iVar3 != 9) {
      if (iVar3 == 10) {
        this->line = this->line + 1;
      }
      else if (iVar3 != 0xd) {
        if (iVar3 == -1) {
          return 0xff;
        }
        if ((iVar3 != 0x5b) && (iVar3 != 0x5d)) {
          if (iVar3 == 0x66) {
            bVar2 = check(this,"alse");
            return (uint)bVar2 * 4 + 0x100;
          }
          if (iVar3 == 0x6e) {
            bVar2 = check(this,"ull");
            return (uint)bVar2 + (uint)bVar2 * 4 + 0x100;
          }
          if (iVar3 == 0x74) {
            bVar2 = check(this,"rue");
            return (uint)bVar2 + (uint)bVar2 * 2 + 0x100;
          }
          if ((iVar3 != 0x7b) && (iVar3 != 0x7d)) {
            return 0x100;
          }
        }
switchD_0021e7a6_caseD_21:
        return iVar3;
      }
    }
    goto switchD_0021e7a6_caseD_20;
  }
LAB_0021e898:
  do {
    uVar4 = uVar5;
    uVar5 = std::streambuf::sbumpc();
    if (uVar5 == 0xffffffff) {
      return 0x100;
    }
    if (uVar5 < 0x20) {
      return 0x100;
    }
    if ((bool)(uVar5 != 0x5c & bVar2)) {
      return 0x100;
    }
    if (uVar5 != 0x5c) {
      if (uVar5 != 0x22) goto LAB_0021e9b4;
      p._M_current = (this->str)._M_dataplus._M_p;
      bVar2 = utf8::validate<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                        (p,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )(p._M_current + (this->str)._M_string_length),false);
      uVar9 = bVar2 | 0x100;
switchD_0021e7a6_caseD_21:
      return uVar9;
    }
    iVar3 = std::streambuf::sbumpc();
    if (iVar3 == -1) {
      return 0x100;
    }
    if ((bool)(iVar3 != 0x75 & bVar2)) {
      return 0x100;
    }
    switch(iVar3) {
    case 0x6e:
      break;
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x73:
      goto switchD_0021e7a6_caseD_21;
    case 0x72:
      break;
    case 0x74:
      break;
    case 0x75:
      buf[4] = '\0';
      buf[0] = '\0';
      buf[1] = '\0';
      buf[2] = '\0';
      buf[3] = '\0';
      plVar6 = (long *)std::istream::get((char *)this->is_,(long)buf);
      if ((*(byte *)((long)plVar6 + *(long *)(*plVar6 + -0x18) + 0x20) & 5) != 0) {
        return 0x100;
      }
      for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
        if (9 < (byte)(buf[lVar7] - 0x30U)) {
          uVar5 = (byte)buf[lVar7] - 0x41;
          if (0x25 < uVar5) {
            return 0x100;
          }
          if ((0x3f0000003fU >> ((ulong)uVar5 & 0x3f) & 1) == 0) {
            return 0x100;
          }
        }
      }
      __isoc99_sscanf(buf,"%x",&local_34);
      x = local_34 & 0xffff;
      uVar8 = (ushort)local_34 & 0xfc00;
      if (!bVar2) goto LAB_0021ea15;
      if (uVar8 != 0xdc00) {
        return 0x100;
      }
      x = (local_34 & 0x3ff) + (uVar4 & 0x3ff) * 0x400 + 0x10000;
      goto LAB_0021ea26;
    default:
      if ((((iVar3 != 0x22) && (iVar3 != 0x2f)) && (iVar3 != 0x66)) &&
         ((iVar3 != 0x62 && (iVar3 != 0x5c)))) {
        return 0x100;
      }
    }
LAB_0021e9b4:
    std::__cxx11::string::push_back((char)this);
    uVar5 = uVar4;
  } while( true );
LAB_0021ea15:
  bVar2 = true;
  uVar5 = local_34;
  if (uVar8 != 0xd800) {
LAB_0021ea26:
    append(this,x);
    bVar2 = false;
    uVar5 = uVar4;
  }
  goto LAB_0021e898;
}

Assistant:

int next()
			{
				std::streambuf *buf = is_.rdbuf();
				for(;;) {
					int c;
					if((c=buf->sbumpc())==-1)
						return tock_eof;
					switch(c) {
					case '[':
					case '{':
					case ':':
					case ',':
					case '}':
					case ']':
						return c;
					case ' ':
					case '\t':
					case '\r':
						break;
					case '\n':
						line++;
						break;
					case '"':
						buf->sungetc();
						if(parse_string())
							return tock_str;
						return tock_err;
					case 't':
						if(check("rue"))
							return tock_true;
						return tock_err;
					case 'n':
						if(check("ull"))
							return tock_null;
						return tock_err;
					case 'f':
						if(check("alse"))
							return tock_false;
						return tock_err;
					case '-':
					case '0':
					case '1':
					case '2':
					case '3':
					case '4':
					case '5':
					case '6':
					case '7':
					case '8':
					case '9':
						buf->sungetc();
						if(parse_number())
							return tock_number;
						return tock_err;
					case '/':
						if(check("/")) {
							while((c=buf->sbumpc())!=-1 && c!='\n')
								;
							if(c=='\n')
								break;
							return tock_eof;
						}
						return tock_err;
					default:
						return tock_err;
					}
				}
			}